

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O0

string * AddLineNumber(string *__return_storage_ptr__,string *s,uint64_t line,string *prefix)

{
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar1;
  basic_formatter *this;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string *local_28;
  string *prefix_local;
  uint64_t line_local;
  string *s_local;
  
  local_28 = prefix;
  prefix_local = (string *)line;
  line_local = (uint64_t)s;
  s_local = __return_storage_ptr__;
  if (line == 0xffffffffffffffff) {
    std::operator+(__return_storage_ptr__,prefix,s);
  }
  else {
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter(&local_1a0);
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1a0,local_28);
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_(pbVar1,(char (*) [7])0xca3e04);
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_(pbVar1,(unsigned_long *)&prefix_local);
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_(pbVar1,(char (*) [3])0xc6f5cb);
    this = (basic_formatter *)
           Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
           operator_(pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            line_local);
    Assimp::Formatter::basic_formatter::operator_cast_to_string(__return_storage_ptr__,this);
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AddLineNumber(const std::string& s,uint64_t line /*= LINE_NOT_SPECIFIED*/, const std::string& prefix = "")
{
    return line == STEP::SyntaxError::LINE_NOT_SPECIFIED ? prefix+s : static_cast<std::string>( (Formatter::format(),prefix,"(line ",line,") ",s) );
}